

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsi-timeout.c
# Opt level: O3

void lws_validity_cb(lws_sorted_usec_list_t *sul)

{
  lws *wsi;
  ulong *puVar1;
  char cVar2;
  sul_cb_t p_Var3;
  lws_dll2 *plVar4;
  code *pcVar5;
  
  wsi = (lws *)(sul + -8);
  if (((ulong)sul[10].list.owner & 0x200) != 0) {
    _lws_log(8,"%s: wsi %p: validity too old\n","lws_validity_cb",wsi);
    __lws_close_free_wsi(wsi,LWS_CLOSE_STATUS_NOSTATUS,"validity timeout");
    return;
  }
  p_Var3 = sul[4].cb;
  cVar2 = *(char *)((long)&sul[10].cb + 5);
  plVar4 = sul[6].list.next;
  _lws_log(8,"%s: wsi %p: scheduling validity check\n","lws_validity_cb",wsi);
  if ((sul[5].cb != (sul_cb_t)0x0) && (pcVar5 = *(code **)(sul[5].cb + 0xa8), pcVar5 != (code *)0x0)
     ) {
    (*pcVar5)(wsi,0);
  }
  if (*(ushort *)((long)&plVar4->next + 4) < *(ushort *)((long)&plVar4->next + 6)) {
    puVar1 = (ulong *)((long)&sul[10].list.next + 4);
    *puVar1 = *puVar1 | 0x20000000000;
    __lws_sul_insert((lws_dll2_owner_t *)(p_Var3 + (long)cVar2 * 0x188 + 0x1c8),sul,
                     ((ulong)*(ushort *)((long)&plVar4->next + 6) -
                     (ulong)*(ushort *)((long)&plVar4->next + 4)) * 1000000);
    return;
  }
  __assert_fail("rbo->secs_since_valid_hangup > rbo->secs_since_valid_ping",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dmikushin[P]libwebsockets/lib/core-net/wsi-timeout.c"
                ,0x134,"void lws_validity_cb(lws_sorted_usec_list_t *)");
}

Assistant:

static void
lws_validity_cb(lws_sorted_usec_list_t *sul)
{
	struct lws *wsi = lws_container_of(sul, struct lws, sul_validity);
	struct lws_context_per_thread *pt = &wsi->context->pt[(int)wsi->tsi];
	const lws_retry_bo_t *rbo = wsi->retry_policy;

	/* one of either the ping or hangup validity threshold was crossed */

	if (wsi->validity_hup) {
		lwsl_info("%s: wsi %p: validity too old\n", __func__, wsi);
		__lws_close_free_wsi(wsi, LWS_CLOSE_STATUS_NOSTATUS,
				     "validity timeout");
		return;
	}

	/* schedule a protocol-dependent ping */

	lwsl_info("%s: wsi %p: scheduling validity check\n", __func__, wsi);

	if (wsi->role_ops && wsi->role_ops->issue_keepalive)
		wsi->role_ops->issue_keepalive(wsi, 0);

	/*
	 * We arrange to come back here after the additional ping to hangup time
	 * and do the hangup, unless we get validated (by, eg, a PONG) and
	 * reset the timer
	 */

	assert(rbo->secs_since_valid_hangup > rbo->secs_since_valid_ping);

	wsi->validity_hup = 1;
	__lws_sul_insert(&pt->pt_sul_owner, &wsi->sul_validity,
			 ((uint64_t)rbo->secs_since_valid_hangup -
				 rbo->secs_since_valid_ping) * LWS_US_PER_SEC);
}